

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void cod_ffs_write(cod_exec_context ec,FFSFile fname,int queue,int index)

{
  FMFormat p_Var1;
  int iVar2;
  queue_item *pqVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  undefined8 in_RSI;
  undefined8 in_RDI;
  void *temp_data;
  FMStructDescList format_list;
  attr_list *temp_attr;
  FMContext fmc;
  queue_item *my_item;
  ev_state_data *ev_state;
  FMFormat file_format;
  FMFormat ref_format;
  undefined8 in_stack_ffffffffffffffa8;
  ev_state_data *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  attr_list *pp_Var6;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  cod_get_client_data(in_RDI,0x34567890);
  pqVar3 = cod_find_index(iVar2,in_stack_ffffffffffffffb0,
                          (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                          (int)in_stack_ffffffffffffffa8);
  if (pqVar3 == (queue_item *)0x0) {
    fprintf(_stderr,"No corresponding item in the queue\n");
  }
  else {
    p_Var1 = pqVar3->item->reference_format;
    uVar4 = FMContext_of_file(in_RSI);
    puVar5 = (undefined8 *)format_list_of_FMFormat(p_Var1);
    uVar4 = FMregister_data_format(uVar4,puVar5);
    pp_Var6 = &pqVar3->item->attrs;
    if (*pp_Var6 == (attr_list)0x0) {
      printf("There is no attr for: %s\n",*puVar5);
    }
    if (pqVar3->item->event_encoded == 0) {
      iVar2 = write_FFSfile_attrs(in_RSI,uVar4,pqVar3->item->decoded_event,*pp_Var6);
      if (iVar2 == 0) {
        fprintf(_stderr,"Error in writing FFS_file!\n");
      }
    }
    else {
      fprintf(_stderr,"Event is encoded, have not handled this case.  Can not write to file\n");
    }
  }
  return;
}

Assistant:

static void
cod_ffs_write(cod_exec_context ec, FFSFile fname,  int queue, int index)
{
    FMFormat ref_format, file_format;
    struct ev_state_data * ev_state = (void*)cod_get_client_data(ec, 0x34567890);
    queue_item * my_item = cod_find_index(0, ev_state, queue, index);
    FMContext fmc;
    attr_list *temp_attr;
    FMStructDescList format_list;

    if(!my_item) {
	fprintf(stderr, "No corresponding item in the queue\n");
	return;
    }

    ref_format = my_item->item->reference_format;
    fmc = FMContext_of_file(fname);

    format_list = format_list_of_FMFormat(ref_format);
    file_format = FMregister_data_format(fmc, format_list);
    
    temp_attr = &my_item->item->attrs;
    if(!*temp_attr) {
	printf("There is no attr for: %s\n", format_list->format_name);
    }
    
    if(my_item->item->event_encoded) {
	fprintf(stderr, "Event is encoded, have not handled this case.  Can not write to file\n");
	return;
    } else {
	void * temp_data = my_item->item->decoded_event;
	if(!write_FFSfile_attrs(fname, file_format, temp_data, *temp_attr))
	    fprintf(stderr, "Error in writing FFS_file!\n");
    }
    return;
}